

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

bool __thiscall
brynet::net::TcpService::helpAddChannel
          (TcpService *this,PTR channel,string *ip,ENTER_CALLBACK *enterCallback,
          DISCONNECT_CALLBACK *disConnectCallback,DATA_CALLBACK *dataCallback,
          bool forceSameThreadLoop)

{
  uint uVar1;
  pointer psVar2;
  pointer pcVar3;
  EventLoop *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  int iVar7;
  pointer psVar8;
  uint *puVar9;
  string *psVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  shared_ptr<brynet::net::TcpService> shared_this;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  undefined8 local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  undefined8 local_120;
  DISCONNECT_CALLBACK *local_118;
  DATA_CALLBACK *local_110;
  ENTER_CALLBACK *local_108;
  string *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  ulong local_b8;
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b0;
  function<void_(long)> local_90;
  function<unsigned_long_(long,_const_char_*,_unsigned_long)> local_70;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_168 = (element_type *)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = enterCallback;
  local_100 = ip;
  iVar6 = rand();
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->mIOLoopGuard);
  if (iVar7 != 0) {
    uVar11 = std::__throw_system_error(iVar7);
    __clang_call_terminate(uVar11);
  }
  psVar8 = (this->mIOLoopDatas).
           super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->mIOLoopDatas).
           super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118 = disConnectCallback;
  local_110 = dataCallback;
  if (psVar8 == psVar2) {
    uVar13 = 0;
LAB_00124b03:
    uVar11 = 0;
  }
  else {
    if (forceSameThreadLoop) {
      psVar8 = (this->mIOLoopDatas).
               super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar15 = (this->mIOLoopDatas).
               super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == psVar8;
      bVar14 = !bVar15;
      if (bVar15) {
        uVar13 = 0;
      }
      else {
        lVar12 = 0;
        uVar13 = 0;
        do {
          uVar1 = *(uint *)(*(long *)(*(long *)((long)&(psVar8->
                                                  super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar12) + 0x10) + 0xbc);
          dataCallback = (DATA_CALLBACK *)(ulong)uVar1;
          puVar9 = (uint *)CurrentThread::tid();
          if (uVar1 == *puVar9) goto LAB_00124ad4;
          uVar13 = uVar13 + 1;
          psVar8 = (this->mIOLoopDatas).
                   super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x10;
          bVar14 = uVar13 < (ulong)((long)(this->mIOLoopDatas).
                                          super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8
                                   >> 4);
        } while (bVar14);
        uVar13 = 0;
      }
LAB_00124ad4:
      if (!bVar14) goto LAB_00124b03;
    }
    else {
      uVar13 = (ulong)(long)iVar6 % (ulong)((long)psVar2 - (long)psVar8 >> 4);
    }
    psVar8 = (this->mIOLoopDatas).
             super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar13;
    local_168 = (psVar8->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_160,
               &(psVar8->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    uVar11 = CONCAT71((int7)((ulong)dataCallback >> 8),1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mIOLoopGuard);
  this_02._M_pi = _Stack_160._M_pi;
  if ((char)uVar11 != '\0') {
    _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_120 = uVar11;
    std::__shared_ptr<brynet::net::TcpService,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<brynet::net::TcpService,void>
              ((__shared_ptr<brynet::net::TcpService,(__gnu_cxx::_Lock_policy)2> *)&local_158,
               (__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<brynet::net::TcpService>);
    local_d8 = local_c8;
    pcVar3 = (local_100->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar3,pcVar3 + local_100->_M_string_length);
    local_b8 = uVar13;
    std::
    function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_b0,local_108);
    std::function<void_(long)>::function(&local_90,local_118);
    std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function(&local_70,local_110);
    local_50 = local_158;
    local_48 = local_150;
    if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_150->_M_use_count = local_150->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_150->_M_use_count = local_150->_M_use_count + 1;
      }
    }
    local_40 = local_168;
    local_38 = this_02._M_pi;
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
      }
    }
    local_138 = (code *)0x0;
    pcStack_130 = (code *)0x0;
    local_148._M_unused._M_object = (void *)0x0;
    local_148._8_8_ = 0;
    psVar10 = (string *)operator_new(0xa8);
    *(string **)psVar10 = psVar10 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar10,local_d8,local_d8 + local_d0);
    *(ulong *)(psVar10 + 0x20) = local_b8;
    std::
    function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)(psVar10 + 0x28),&local_b0);
    std::function<void_(long)>::function((function<void_(long)> *)(psVar10 + 0x48),&local_90);
    std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function
              ((function<unsigned_long_(long,_const_char_*,_unsigned_long)> *)(psVar10 + 0x68),
               &local_70);
    p_Var5 = local_38;
    p_Var4 = local_48;
    *(undefined8 *)(psVar10 + 0x88) = local_50;
    *(undefined8 *)(psVar10 + 0x90) = 0;
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar10 + 0x90) = p_Var4;
    local_50 = 0;
    *(element_type **)(psVar10 + 0x98) = local_40;
    *(undefined8 *)(psVar10 + 0xa0) = 0;
    local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar10 + 0xa0) = p_Var5;
    local_40 = (element_type *)0x0;
    pcStack_130 = std::
                  _Function_handler<void_(brynet::net::DataSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:366:31)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(brynet::net::DataSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:366:31)>
                ::_M_manager;
    local_148._M_unused._0_8_ = (undefined8)psVar10;
    DataSocket::setEnterCallback(channel,(ENTER_CALLBACK *)&local_148);
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,__destroy_functor);
    }
    helpAddChannel(brynet::net::DataSocket*,std::__cxx11::string_const&,std::function<void(long,std::__cxx11::string_const&)>const&,std::function<void(long)>const&,std::function<unsigned_long(long,char_const*,unsigned_long)>const&,bool)
    ::$_0::~__0((__0 *)&local_d8);
    this_00 = (local_168->mEventLoop).
              super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_168->mEventLoop + 8))->_M_pi;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
    }
    local_e8 = (code *)0x0;
    pcStack_e0 = (code *)0x0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = operator_new(0x18);
    *(EventLoop **)local_f8._M_unused._0_8_ = this_00;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 8) =
         this_01._M_pi;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
    }
    *(PTR *)((long)local_f8._M_unused._0_8_ + 0x10) = channel;
    pcStack_e0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:398:25)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:398:25)>
               ::_M_manager;
    EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_f8);
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
    }
    uVar11 = local_120;
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
  }
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  return (bool)(char)uVar11;
}

Assistant:

bool TcpService::helpAddChannel(DataSocket::PTR channel, 
    const std::string& ip, 
    const TcpService::ENTER_CALLBACK& enterCallback, 
    const TcpService::DISCONNECT_CALLBACK& disConnectCallback, 
    const TcpService::DATA_CALLBACK& dataCallback,
    bool forceSameThreadLoop)
{
    std::shared_ptr<IOLoopData> ioLoopData;
    size_t loopIndex = 0;
    {
        auto randNum = rand();
        std::lock_guard<std::mutex> lock(mIOLoopGuard);

        if (mIOLoopDatas.empty())
        {
            return false;
        }
        
        if (forceSameThreadLoop)
        {
            bool find = false;
            for (size_t i = 0; i < mIOLoopDatas.size(); i++)
            {
                if (mIOLoopDatas[i]->getEventLoop()->isInLoopThread())
                {
                    loopIndex = i;
                    find = true;
                    break;
                }
            }
            if (!find)
            {
                return false;
            }
        }
        else
        {
            loopIndex = randNum % mIOLoopDatas.size();
        }

        ioLoopData = mIOLoopDatas[loopIndex];
    }
    

    const auto& loop = ioLoopData->getEventLoop();
    auto loopDataCapture = std::move(ioLoopData);
    auto shared_this = shared_from_this();
    channel->setEnterCallback([ip, 
        loopIndex, 
        enterCallback, 
        disConnectCallback, 
        dataCallback, 
        shared_this,
        loopDataCapture](DataSocket::PTR dataSocket){
        auto id = shared_this->MakeID(loopIndex, loopDataCapture);
        union SessionId sid;
        sid.id = id;
        loopDataCapture->getDataSockets().set(dataSocket, sid.data.index);
        dataSocket->setUD(id);
        dataSocket->setDataCallback([dataCallback, 
            id](DataSocket::PTR ds, const char* buffer, size_t len){
            return dataCallback(id, buffer, len);
        });

        dataSocket->setDisConnectCallback([disConnectCallback, 
            id, 
            shared_this](DataSocket::PTR arg){
            shared_this->procDataSocketClose(arg);
            disConnectCallback(id);
            delete arg;
        });

        if (enterCallback != nullptr)
        {
            enterCallback(id, ip);
        }
    });

    //TODO::����channel �ڴ�����ȫ�ķ�ʽ
    loop->pushAsyncProc([loop, channel](){
        if (!channel->onEnterEventLoop(std::move(loop)))
        {
            delete channel;
        }
    });

    return true;
}